

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::ScanLineInputFile::Data::Data(Data *this,int numThreads)

{
  size_type __new_size;
  long in_RDI;
  Vec2<float> *this_00;
  undefined8 in_stack_ffffffffffffffa8;
  Compression compression;
  undefined8 in_stack_ffffffffffffffb0;
  V2f *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  float pixelAspectRatio;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int local_28 [5];
  Vec2<float> local_14 [2];
  
  pixelAspectRatio = (float)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  compression = (Compression)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  std::mutex::mutex((mutex *)0x7d28d8);
  __new_size = in_RDI + 0x28;
  this_00 = local_14;
  Imath_2_5::Vec2<float>::Vec2(this_00,0.0,0.0);
  Header::Header((Header *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,pixelAspectRatio,in_stack_ffffffffffffffb8
                 ,(float)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                 (LineOrder)in_stack_ffffffffffffffb0,compression);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x7d293b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x7d2951);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x7d2967);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x7d297d);
  std::
  vector<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
            *)0x7d2993);
  std::
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            *)0x7d29a9);
  *(undefined4 *)(in_RDI + 0x140) = 0xffffffff;
  *(undefined1 *)(in_RDI + 0x144) = 0;
  OptimizationMode::OptimizationMode((OptimizationMode *)(in_RDI + 0x148));
  std::
  vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
  ::vector((vector<Imf_2_5::(anonymous_namespace)::sliceOptimizationData,_std::allocator<Imf_2_5::(anonymous_namespace)::sliceOptimizationData>_>
            *)0x7d29e3);
  local_28[0] = 1;
  std::max<int>(local_28,(int *)&stack0xffffffffffffffd4);
  std::
  vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
  ::resize((vector<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            *)this_00,__new_size);
  return;
}

Assistant:

ScanLineInputFile::Data::Data (int numThreads):
        partNumber(-1),
        memoryMapped(false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers
    //

    lineBuffers.resize (max (1, 2 * numThreads));
}